

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::fea::ChContactTriangleXYZ::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChContactTriangleXYZ *this,double U,double V)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ChVector<double> *v;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar20 [16];
  
  peVar8 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var9 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
    }
  }
  dVar18 = *(double *)&(peVar8->super_ChNodeFEAbase).field_0x20;
  dVar10 = *(double *)&peVar8->field_0x28;
  dVar1 = *(double *)&peVar8->field_0x30;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  peVar8 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var9 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
    }
  }
  dVar2 = *(double *)&(peVar8->super_ChNodeFEAbase).field_0x20;
  dVar3 = *(double *)&peVar8->field_0x28;
  dVar4 = *(double *)&peVar8->field_0x30;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  peVar8 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var9 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
    }
  }
  dVar5 = *(double *)&(peVar8->super_ChNodeFEAbase).field_0x20;
  dVar6 = *(double *)&peVar8->field_0x28;
  dVar7 = *(double *)&peVar8->field_0x30;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  dVar2 = dVar2 - dVar18;
  dVar3 = dVar3 - dVar10;
  dVar4 = dVar4 - dVar1;
  dVar5 = dVar5 - dVar18;
  dVar6 = dVar6 - dVar10;
  dVar7 = dVar7 - dVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar7;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar6 * dVar4;
  auVar13 = vfmsub231sd_fma(auVar21,auVar13,auVar19);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar5;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar7 * dVar2;
  auVar11 = vfmsub231sd_fma(auVar20,auVar16,auVar14);
  dVar18 = auVar11._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar5 * dVar3;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar6;
  auVar14 = vfmsub231sd_fma(auVar15,auVar11,auVar17);
  __return_storage_ptr__->m_data[0] = auVar13._0_8_;
  __return_storage_ptr__->m_data[1] = dVar18;
  __return_storage_ptr__->m_data[2] = auVar14._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar18 * dVar18;
  auVar11 = vfmadd231sd_fma(auVar12,auVar13,auVar13);
  auVar11 = vfmadd231sd_fma(auVar11,auVar14,auVar14);
  if (auVar11._0_8_ < 0.0) {
    dVar10 = sqrt(auVar11._0_8_);
  }
  else {
    auVar11 = vsqrtsd_avx(auVar11,auVar11);
    dVar10 = auVar11._0_8_;
  }
  if (dVar10 < 2.2250738585072014e-308) {
    __return_storage_ptr__->m_data[0] = 1.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    dVar10 = 0.0;
  }
  else {
    dVar10 = 1.0 / dVar10;
    __return_storage_ptr__->m_data[0] = auVar13._0_8_ * dVar10;
    __return_storage_ptr__->m_data[1] = dVar18 * dVar10;
    dVar10 = auVar14._0_8_ * dVar10;
  }
  __return_storage_ptr__->m_data[2] = dVar10;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChContactTriangleXYZ::ComputeNormal(const double U, const double V) {
    ChVector<> p0 = GetNode1()->GetPos();
    ChVector<> p1 = GetNode2()->GetPos();
    ChVector<> p2 = GetNode3()->GetPos();
    return Vcross(p1 - p0, p2 - p0).GetNormalized();
}